

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void __thiscall SystemError::SystemError(SystemError *this,int type)

{
  char *__s;
  
  (this->super_ENerror).code = 0;
  (this->super_ENerror).msg._M_dataplus._M_p = (pointer)&(this->super_ENerror).msg.field_2;
  (this->super_ENerror).msg._M_string_length = 0;
  (this->super_ENerror).msg.field_2._M_local_buf[0] = '\0';
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__ENerror_00156a10;
  if ((uint)type < 0xc) {
    (this->super_ENerror).code = SystemErrorCodes[(uint)type];
    __s = SystemErrorMsgs[(uint)type];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&(this->super_ENerror).msg,0,(char *)0x0,(ulong)__s);
  }
  return;
}

Assistant:

SystemError::SystemError(int type)
{
    if ( type >= 0 && type < SYSTEM_ERROR_LIMIT )
    {
        code = SystemErrorCodes[type];
        msg =  SystemErrorMsgs[type];
    }
}